

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::if_statement::print(if_statement *this,wostream *os)

{
  bool bVar1;
  wostream *pwVar2;
  syntax_node *psVar3;
  wostream *os_local;
  if_statement *this_local;
  
  pwVar2 = std::operator<<(os,"if_statement{");
  psVar3 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->cond_)->super_syntax_node;
  pwVar2 = mjs::operator<<(pwVar2,psVar3);
  pwVar2 = std::operator<<(pwVar2,", ");
  psVar3 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                      (&this->if_s_)->super_syntax_node;
  mjs::operator<<(pwVar2,psVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->else_s_);
  if (bVar1) {
    pwVar2 = std::operator<<(os,", ");
    psVar3 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                        (&this->else_s_)->super_syntax_node;
    mjs::operator<<(pwVar2,psVar3);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "if_statement{" << *cond_ << ", " << *if_s_;
        if (else_s_) os << ", " << *else_s_;
        os << "}";
    }